

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer_queue.hpp
# Opt level: O0

void __thiscall
asio::detail::
timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
::get_all_timers(timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>
                 *this,op_queue<asio::detail::scheduler_operation> *ops)

{
  op_queue<asio::detail::scheduler_operation> *in_RSI;
  long in_RDI;
  per_timer_data *timer;
  op_queue<asio::detail::wait_op> *q;
  
  while (*(long *)(in_RDI + 0x10) != 0) {
    q = *(op_queue<asio::detail::wait_op> **)(in_RDI + 0x10);
    *(undefined8 *)(in_RDI + 0x10) = *(undefined8 *)(*(long *)(in_RDI + 0x10) + 0x18);
    op_queue<asio::detail::scheduler_operation>::push<asio::detail::wait_op>(in_RSI,q);
    q[1].back_ = (wait_op *)0x0;
    q[2].front_ = (wait_op *)0x0;
  }
  std::
  vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
  ::clear((vector<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry,_std::allocator<asio::detail::timer_queue<asio::detail::chrono_time_traits<std::chrono::_V2::steady_clock,_asio::wait_traits<std::chrono::_V2::steady_clock>_>_>::heap_entry>_>
           *)0x1d83c7);
  return;
}

Assistant:

virtual void get_all_timers(op_queue<operation>& ops)
  {
    while (timers_)
    {
      per_timer_data* timer = timers_;
      timers_ = timers_->next_;
      ops.push(timer->op_queue_);
      timer->next_ = 0;
      timer->prev_ = 0;
    }

    heap_.clear();
  }